

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall
FIX::double_conversion::Bignum::AssignDecimalString(Bignum *this,Vector<const_char> value)

{
  bool bVar1;
  uint64_t uVar2;
  uint uVar3;
  int in_R8D;
  uint from;
  uint uVar4;
  ulong uVar5;
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  
  uVar3 = value.length_;
  Zero(this);
  uVar5 = 0;
  from = uVar3;
  if (0x12 < (int)uVar3) {
    uVar5 = 0;
    uVar4 = uVar3;
    do {
      buffer.start_ = (char *)(ulong)uVar3;
      buffer._8_8_ = uVar5;
      uVar2 = ReadUInt64((double_conversion *)value.start_,buffer,0x13,in_R8D);
      uVar5 = (ulong)((int)uVar5 + 0x13);
      from = uVar4 - 0x13;
      MultiplyByPowerOfTen(this,0x13);
      AddUInt64(this,uVar2);
      bVar1 = 0x25 < uVar4;
      uVar4 = from;
    } while (bVar1);
  }
  buffer_00.start_ = (char *)(ulong)uVar3;
  buffer_00._8_8_ = uVar5;
  uVar2 = ReadUInt64((double_conversion *)value.start_,buffer_00,from,in_R8D);
  MultiplyByPowerOfTen(this,from);
  AddUInt64(this,uVar2);
  Clamp(this);
  return;
}

Assistant:

void Bignum::AssignDecimalString(Vector<const char> value) {
  // 2^64 = 18446744073709551616 > 10^19
  const int kMaxUint64DecimalDigits = 19;
  Zero();
  int length = value.length();
  int pos = 0;
  // Let's just say that each digit needs 4 bits.
  while (length >= kMaxUint64DecimalDigits) {
    uint64_t digits = ReadUInt64(value, pos, kMaxUint64DecimalDigits);
    pos += kMaxUint64DecimalDigits;
    length -= kMaxUint64DecimalDigits;
    MultiplyByPowerOfTen(kMaxUint64DecimalDigits);
    AddUInt64(digits);
  }
  uint64_t digits = ReadUInt64(value, pos, length);
  MultiplyByPowerOfTen(length);
  AddUInt64(digits);
  Clamp();
}